

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorldImporter.cpp
# Opt level: O3

cbtStridingMeshInterfaceData * __thiscall
cbtCollisionWorldImporter::createStridingMeshInterfaceData
          (cbtCollisionWorldImporter *this,cbtStridingMeshInterfaceData *interfaceData)

{
  int iVar1;
  cbtMeshPartData *pcVar2;
  long lVar3;
  cbtStridingMeshInterfaceData **ptr;
  undefined1 auVar4 [16];
  undefined8 uVar5;
  uint uVar6;
  cbtStridingMeshInterfaceData *pcVar7;
  ulong uVar8;
  cbtMeshPartData *pcVar9;
  void *pvVar10;
  cbtStridingMeshInterfaceData **ppcVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  size_t sVar15;
  size_t sVar16;
  ulong uVar17;
  cbtShortIntIndexData **ppcVar18;
  long local_58;
  
  pcVar7 = (cbtStridingMeshInterfaceData *)::operator_new(0x20);
  uVar5 = *(undefined8 *)((interfaceData->m_scaling).m_floats + 2);
  *(undefined8 *)(pcVar7->m_scaling).m_floats = *(undefined8 *)(interfaceData->m_scaling).m_floats;
  *(undefined8 *)((pcVar7->m_scaling).m_floats + 2) = uVar5;
  uVar17 = (ulong)interfaceData->m_numMeshParts;
  pcVar7->m_numMeshParts = interfaceData->m_numMeshParts;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar17;
  uVar8 = SUB168(auVar4 * ZEXT816(0x38),0);
  if (SUB168(auVar4 * ZEXT816(0x38),8) != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  pcVar9 = (cbtMeshPartData *)operator_new__(uVar8);
  pcVar7->m_meshPartsPtr = pcVar9;
  if (0 < (long)uVar17) {
    pcVar2 = interfaceData->m_meshPartsPtr;
    lVar13 = 0;
    local_58 = 0;
    do {
      iVar12 = *(int *)((long)&pcVar2->m_numTriangles + lVar13);
      lVar14 = (long)iVar12;
      *(int *)((long)&pcVar9->m_numTriangles + lVar13) = iVar12;
      iVar1 = *(int *)((long)&pcVar2->m_numVertices + lVar13);
      *(int *)((long)&pcVar9->m_numVertices + lVar13) = iVar1;
      if (*(long *)((long)&pcVar2->m_vertices3f + lVar13) == 0) {
        *(undefined8 *)((long)&pcVar9->m_vertices3f + lVar13) = 0;
      }
      else {
        sVar16 = (long)iVar1 << 4;
        sVar15 = sVar16;
        if (iVar1 < 0) {
          sVar15 = 0xffffffffffffffff;
        }
        pvVar10 = operator_new__(sVar15);
        *(void **)((long)&pcVar9->m_vertices3f + lVar13) = pvVar10;
        memcpy(pvVar10,*(void **)((long)&pcVar2->m_vertices3f + lVar13),sVar16);
      }
      if (*(long *)((long)&pcVar2->m_vertices3d + lVar13) == 0) {
        *(undefined8 *)((long)&pcVar9->m_vertices3d + lVar13) = 0;
      }
      else {
        sVar16 = (long)iVar1 << 5;
        sVar15 = sVar16;
        if (iVar1 < 0) {
          sVar15 = 0xffffffffffffffff;
        }
        pvVar10 = operator_new__(sVar15);
        *(void **)((long)&pcVar9->m_vertices3d + lVar13) = pvVar10;
        memcpy(pvVar10,*(void **)((long)&pcVar2->m_vertices3d + lVar13),sVar16);
      }
      lVar3 = *(long *)((long)&pcVar2->m_indices32 + lVar13);
      if (lVar3 == 0) {
        *(undefined8 *)((long)&pcVar9->m_indices32 + lVar13) = 0;
      }
      else {
        sVar15 = lVar14 * 0xc;
        if (iVar12 < 0) {
          sVar15 = 0xffffffffffffffff;
        }
        pvVar10 = operator_new__(sVar15);
        *(void **)((long)&pcVar9->m_indices32 + lVar13) = pvVar10;
        memcpy(pvVar10,*(void **)((long)&pcVar2->m_indices32 + lVar13),lVar14 * 0xc);
      }
      if (*(long *)((long)&pcVar2->m_3indices16 + lVar13) == 0) {
        *(undefined8 *)((long)&pcVar9->m_3indices16 + lVar13) = 0;
        if (*(long *)((long)&pcVar2->m_indices16 + lVar13) != 0) {
          ppcVar18 = &pcVar2[local_58].m_indices16;
          goto LAB_008b32eb;
        }
        *(undefined8 *)((long)&pcVar9->m_indices16 + lVar13) = 0;
        if ((lVar3 != 0) || (*(long *)((long)&pcVar2->m_3indices8 + lVar13) == 0))
        goto LAB_008b3336;
        sVar15 = lVar14 << 2;
        if (iVar12 < 0) {
          sVar15 = 0xffffffffffffffff;
        }
        pvVar10 = operator_new__(sVar15);
        *(void **)((long)&pcVar9->m_3indices8 + lVar13) = pvVar10;
        memcpy(pvVar10,*(void **)((long)&pcVar2->m_3indices8 + lVar13),lVar14 << 2);
      }
      else {
        sVar15 = lVar14 * 8;
        if (iVar12 < 0) {
          sVar15 = 0xffffffffffffffff;
        }
        pvVar10 = operator_new__(sVar15);
        *(void **)((long)&pcVar9->m_3indices16 + lVar13) = pvVar10;
        memcpy(pvVar10,*(void **)((long)&pcVar2->m_3indices16 + lVar13),lVar14 * 8);
        if (*(long *)((long)&pcVar2->m_indices16 + lVar13) == 0) {
          *(undefined8 *)((long)&pcVar9->m_indices16 + lVar13) = 0;
        }
        else {
          ppcVar18 = (cbtShortIntIndexData **)((long)&pcVar2->m_indices16 + lVar13);
LAB_008b32eb:
          sVar16 = (long)(iVar12 * 3) << 2;
          sVar15 = sVar16;
          if (iVar12 < 0) {
            sVar15 = 0xffffffffffffffff;
          }
          pvVar10 = operator_new__(sVar15);
          *(void **)((long)&pcVar9->m_indices16 + lVar13) = pvVar10;
          memcpy(pvVar10,*ppcVar18,sVar16);
        }
LAB_008b3336:
        *(undefined8 *)((long)&pcVar9->m_3indices8 + lVar13) = 0;
      }
      local_58 = local_58 + 1;
      lVar13 = lVar13 + 0x38;
    } while (uVar17 * 0x38 != lVar13);
  }
  uVar6 = (this->m_allocatedcbtStridingMeshInterfaceDatas).m_size;
  if (uVar6 == (this->m_allocatedcbtStridingMeshInterfaceDatas).m_capacity) {
    iVar12 = 1;
    if (uVar6 != 0) {
      iVar12 = uVar6 * 2;
    }
    if ((int)uVar6 < iVar12) {
      if (iVar12 == 0) {
        ppcVar11 = (cbtStridingMeshInterfaceData **)0x0;
      }
      else {
        ppcVar11 = (cbtStridingMeshInterfaceData **)cbtAlignedAllocInternal((long)iVar12 << 3,0x10);
        uVar6 = (this->m_allocatedcbtStridingMeshInterfaceDatas).m_size;
      }
      if (0 < (int)uVar6) {
        uVar8 = 0;
        do {
          ppcVar11[uVar8] = (this->m_allocatedcbtStridingMeshInterfaceDatas).m_data[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar6 != uVar8);
      }
      ptr = (this->m_allocatedcbtStridingMeshInterfaceDatas).m_data;
      if ((ptr != (cbtStridingMeshInterfaceData **)0x0) &&
         ((this->m_allocatedcbtStridingMeshInterfaceDatas).m_ownsMemory == true)) {
        cbtAlignedFreeInternal(ptr);
        uVar6 = (this->m_allocatedcbtStridingMeshInterfaceDatas).m_size;
      }
      (this->m_allocatedcbtStridingMeshInterfaceDatas).m_ownsMemory = true;
      (this->m_allocatedcbtStridingMeshInterfaceDatas).m_data = ppcVar11;
      (this->m_allocatedcbtStridingMeshInterfaceDatas).m_capacity = iVar12;
    }
  }
  (this->m_allocatedcbtStridingMeshInterfaceDatas).m_data[(int)uVar6] = pcVar7;
  (this->m_allocatedcbtStridingMeshInterfaceDatas).m_size = uVar6 + 1;
  return pcVar7;
}

Assistant:

cbtStridingMeshInterfaceData* cbtCollisionWorldImporter::createStridingMeshInterfaceData(cbtStridingMeshInterfaceData* interfaceData)
{
	//create a new cbtStridingMeshInterfaceData that is an exact copy of shapedata and store it in the WorldImporter
	cbtStridingMeshInterfaceData* newData = new cbtStridingMeshInterfaceData;

	newData->m_scaling = interfaceData->m_scaling;
	newData->m_numMeshParts = interfaceData->m_numMeshParts;
	newData->m_meshPartsPtr = new cbtMeshPartData[newData->m_numMeshParts];

	for (int i = 0; i < newData->m_numMeshParts; i++)
	{
		cbtMeshPartData* curPart = &interfaceData->m_meshPartsPtr[i];
		cbtMeshPartData* curNewPart = &newData->m_meshPartsPtr[i];

		curNewPart->m_numTriangles = curPart->m_numTriangles;
		curNewPart->m_numVertices = curPart->m_numVertices;

		if (curPart->m_vertices3f)
		{
			curNewPart->m_vertices3f = new cbtVector3FloatData[curNewPart->m_numVertices];
			memcpy(curNewPart->m_vertices3f, curPart->m_vertices3f, sizeof(cbtVector3FloatData) * curNewPart->m_numVertices);
		}
		else
			curNewPart->m_vertices3f = NULL;

		if (curPart->m_vertices3d)
		{
			curNewPart->m_vertices3d = new cbtVector3DoubleData[curNewPart->m_numVertices];
			memcpy(curNewPart->m_vertices3d, curPart->m_vertices3d, sizeof(cbtVector3DoubleData) * curNewPart->m_numVertices);
		}
		else
			curNewPart->m_vertices3d = NULL;

		int numIndices = curNewPart->m_numTriangles * 3;
		///the m_3indices8 was not initialized in some Bullet versions, this can cause crashes at loading time
		///we catch it by only dealing with m_3indices8 if none of the other indices are initialized
		bool uninitialized3indices8Workaround = false;

		if (curPart->m_indices32)
		{
			uninitialized3indices8Workaround = true;
			curNewPart->m_indices32 = new cbtIntIndexData[numIndices];
			memcpy(curNewPart->m_indices32, curPart->m_indices32, sizeof(cbtIntIndexData) * numIndices);
		}
		else
			curNewPart->m_indices32 = NULL;

		if (curPart->m_3indices16)
		{
			uninitialized3indices8Workaround = true;
			curNewPart->m_3indices16 = new cbtShortIntIndexTripletData[curNewPart->m_numTriangles];
			memcpy(curNewPart->m_3indices16, curPart->m_3indices16, sizeof(cbtShortIntIndexTripletData) * curNewPart->m_numTriangles);
		}
		else
			curNewPart->m_3indices16 = NULL;

		if (curPart->m_indices16)
		{
			uninitialized3indices8Workaround = true;
			curNewPart->m_indices16 = new cbtShortIntIndexData[numIndices];
			memcpy(curNewPart->m_indices16, curPart->m_indices16, sizeof(cbtShortIntIndexData) * numIndices);
		}
		else
			curNewPart->m_indices16 = NULL;

		if (!uninitialized3indices8Workaround && curPart->m_3indices8)
		{
			curNewPart->m_3indices8 = new cbtCharIndexTripletData[curNewPart->m_numTriangles];
			memcpy(curNewPart->m_3indices8, curPart->m_3indices8, sizeof(cbtCharIndexTripletData) * curNewPart->m_numTriangles);
		}
		else
			curNewPart->m_3indices8 = NULL;
	}

	m_allocatedcbtStridingMeshInterfaceDatas.push_back(newData);

	return (newData);
}